

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O3

void __thiscall
my_algorithm::WeightedDigraphSPAcyclic<int,_int>::WeightedDigraphSPAcyclic
          (WeightedDigraphSPAcyclic<int,_int> *this,WeightedDigraph<int,_int> *graph)

{
  size_t *psVar1;
  int iVar2;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar3;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar4;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar5;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar6;
  pointer ppRVar7;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar8;
  __normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*const_*,_std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>_>
  _Var9;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar10;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar11;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  *__range2;
  pointer ppRVar12;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  nodes;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *node;
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  local_58;
  undefined8 local_40;
  Node *local_38;
  
  this->_vptr_WeightedDigraphSPAcyclic = (_func_int **)&PTR__WeightedDigraphSPAcyclic_0010ccc8;
  (this->_edge_to)._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010cab8;
  (this->_edge_to)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cae8;
  pLVar6 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar6->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cb18;
  (pLVar6->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cb48;
  pLVar6->_next =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar6->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar6->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar6->element).value.weight = 0;
  (this->_edge_to)._list._header = pLVar6;
  (this->_edge_to)._list._tail = pLVar6;
  (this->_edge_to)._list._size = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__LinkedList_0010cae8;
  ppRVar7 = (pointer)operator_new(0x38);
  *ppRVar7 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)&PTR__ListNode_0010cb18;
  ppRVar7[2] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)&PTR__SymbolTableElement_0010cb48;
  ppRVar7[1] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  ppRVar7[4] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  ppRVar7[5] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  *(undefined4 *)(ppRVar7 + 6) = 0;
  local_40 = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppRVar7;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppRVar7;
  pLVar6 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar6->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cb18;
  (pLVar6->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cb48;
  pLVar6->_next =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar6->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar6->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar6->element).value.weight = 0;
  (this->_edge_to)._list._header = pLVar6;
  (this->_edge_to)._list._tail = pLVar6;
  (this->_edge_to)._list._size = 0;
  operator_delete(ppRVar7,0x38);
  (this->_weight_to)._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010cb78;
  (this->_weight_to)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010cba8;
  pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cbd8;
  (pLVar8->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cc08;
  pLVar8->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  (this->_weight_to)._list._header = pLVar8;
  (this->_weight_to)._list._tail = pLVar8;
  (this->_weight_to)._list._size = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__LinkedList_0010cba8;
  ppRVar7 = (pointer)operator_new(0x20);
  *ppRVar7 = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
              *)&PTR__ListNode_0010cbd8;
  ppRVar7[2] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)&PTR__SymbolTableElement_0010cc08;
  ppRVar7[1] = (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
                *)0x0;
  local_40 = 0;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppRVar7;
  local_58.
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppRVar7;
  pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cbd8;
  (pLVar8->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cc08;
  pLVar8->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  (this->_weight_to)._list._header = pLVar8;
  (this->_weight_to)._list._tail = pLVar8;
  (this->_weight_to)._list._size = 0;
  operator_delete(ppRVar7,0x20);
  (this->_reserve_post_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_reserve_post_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_marked_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_reserve_post_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_marked_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_marked_nodes).
  super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getAllNodes
            (&local_58,&(graph->super_WeightedGraph<int,_int>)._tree);
  ppRVar7 = local_58.
            super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_58.
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppRVar12 = local_58.
               super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_38 = *ppRVar12;
      _Var9 = std::
              __find_if<__gnu_cxx::__normal_iterator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*const*,std::vector<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*,std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*>>>,__gnu_cxx::__ops::_Iter_equals_val<data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*const>>
                        ((this->_marked_nodes).
                         super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (this->_marked_nodes).
                         super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_38);
      if (_Var9._M_current ==
          (this->_marked_nodes).
          super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        _dfs(this,local_38);
      }
      ppRVar12 = ppRVar12 + 1;
    } while (ppRVar12 != ppRVar7);
  }
  pRVar3 = *(this->_reserve_post_nodes).
            super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this->_start = (pRVar3->element).key;
  pLVar6 = (this->_edge_to)._list._tail;
  pLVar10 = (this->_edge_to)._list._header;
  while (pLVar10 != pLVar6) {
    pLVar4 = pLVar10->_next;
    if (pLVar4 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      pLVar10->_next = pLVar4->_next;
      (*pLVar4->_vptr_ListNode[1])(pLVar4);
      pLVar6 = (this->_edge_to)._list._tail;
    }
    if (pLVar4 == pLVar6) {
      (this->_edge_to)._list._tail = pLVar10;
      pLVar6 = pLVar10;
    }
    psVar1 = &(this->_edge_to)._list._size;
    *psVar1 = *psVar1 - 1;
    pLVar10 = (this->_edge_to)._list._header;
  }
  (this->_edge_to)._list._tail = pLVar10;
  (this->_edge_to)._list._size = 0;
  pLVar8 = (this->_weight_to)._list._header;
  pLVar11 = (this->_weight_to)._list._tail;
  if (pLVar8 != pLVar11) {
    do {
      pLVar5 = pLVar8->_next;
      if (pLVar5 != (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
        pLVar8->_next = pLVar5->_next;
        (*pLVar5->_vptr_ListNode[1])(pLVar5);
        pLVar11 = (this->_weight_to)._list._tail;
      }
      if (pLVar5 == pLVar11) {
        (this->_weight_to)._list._tail = pLVar8;
        pLVar11 = pLVar8;
      }
      psVar1 = &(this->_weight_to)._list._size;
      *psVar1 = *psVar1 - 1;
      pLVar8 = (this->_weight_to)._list._header;
    } while (pLVar8 != pLVar11);
    pLVar10 = (this->_edge_to)._list._header;
  }
  (this->_weight_to)._list._tail = pLVar8;
  (this->_weight_to)._list._size = 0;
  iVar2 = this->_start;
  do {
    pLVar10 = pLVar10->_next;
    if (pLVar10 ==
        (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
         *)0x0) {
      pLVar6 = (this->_edge_to)._list._tail;
      pLVar10 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                 *)operator_new(0x38);
      pLVar10->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cb18;
      (pLVar10->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cb48;
      (pLVar10->element).key = iVar2;
      (pLVar10->element).value.from = pRVar3;
      (pLVar10->element).value.to = pRVar3;
      (pLVar10->element).value.weight = 0;
      pLVar10->_next = pLVar6->_next;
      pLVar6->_next = pLVar10;
      psVar1 = &(this->_edge_to)._list._size;
      *psVar1 = *psVar1 + 1;
      (this->_edge_to)._list._tail = pLVar10;
      goto LAB_00103f8f;
    }
  } while ((pLVar10->element).key != iVar2);
  (pLVar10->element).value.from = pRVar3;
  (pLVar10->element).value.to = pRVar3;
  (pLVar10->element).value.weight = 0;
LAB_00103f8f:
  iVar2 = this->_start;
  pLVar11 = pLVar8;
  do {
    pLVar11 = pLVar11->_next;
    if (pLVar11 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      pLVar11 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
      pLVar11->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010cbd8;
      (pLVar11->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010cc08;
      (pLVar11->element).key = iVar2;
      (pLVar11->element).value = 0;
      pLVar11->_next = pLVar8->_next;
      pLVar8->_next = pLVar11;
      (this->_weight_to)._list._size = 1;
      (this->_weight_to)._list._tail = pLVar11;
      goto LAB_00103ff0;
    }
  } while ((pLVar11->element).key != iVar2);
  (pLVar11->element).value = 0;
LAB_00103ff0:
  ppRVar12 = (this->_reserve_post_nodes).
             super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  for (ppRVar7 = (this->_reserve_post_nodes).
                 super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppRVar7 != ppRVar12;
      ppRVar7 = ppRVar7 + 1) {
    _relax(this,graph,*ppRVar7);
  }
  if (local_58.
      super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

WeightedDigraphSPAcyclic(WeightedDigraph<T, Weight> &graph) {
            _marked_nodes.clear();
            _reserve_post_nodes.clear();
            auto nodes = graph.getAllNodes();
            // Topological sorting
            for (auto node: nodes) {
                if (!isInVector<Node*>(_marked_nodes, node)) {
                    _dfs(node);
                }
            }

            auto start_node = _reserve_post_nodes[0];
            _start = start_node->element.key;
            _edge_to.clear();
            _weight_to.clear();
            _edge_to.set(_start, Edge(start_node, start_node, Weight()));
            _weight_to.set(_start, Weight());

            for (auto node: _reserve_post_nodes) {
                _relax(graph, node);
            }
        }